

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

Array<int> * __thiscall asl::Array<int>::reserve(Array<int> *this,int m)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  void *pvVar5;
  undefined8 *puVar6;
  int __fd;
  int iVar7;
  int *__dest;
  size_t __size;
  
  piVar4 = this->_a;
  iVar1 = piVar4[-3];
  if (iVar1 < m) {
    iVar7 = iVar1 * 2;
    if (iVar1 * 2 <= m) {
      iVar7 = m;
    }
    iVar2 = piVar4[-4];
    if (((long)iVar1 & 0x3ffffffffffffe00U) == 0) {
      pvVar5 = malloc((long)iVar7 * 4 + 0x10);
      if (pvVar5 == (void *)0x0) goto LAB_0011c27e;
      __dest = (int *)((long)pvVar5 + 0x10);
      if (iVar2 <= m) {
        m = iVar2;
      }
      memcpy(__dest,piVar4,(long)(m << 2));
      __fd = (int)piVar4;
    }
    else {
      dup(this,m);
      iVar3 = this->_a[-2];
      __size = (long)iVar7 * 4 + 0x10;
      piVar4 = (int *)realloc(this->_a + -4,__size);
      __fd = (int)__size;
      if (piVar4 == (int *)0x0) {
LAB_0011c27e:
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = dup2;
        __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      __dest = piVar4 + 4;
      this->_a = __dest;
      piVar4[2] = iVar3;
      piVar4[1] = iVar7;
      *piVar4 = iVar2;
      iVar7 = iVar1;
    }
    if (iVar7 != iVar1) {
      dup(this,__fd);
      iVar1 = this->_a[-2];
      free(this->_a + -4);
      this->_a = __dest;
      __dest[-2] = iVar1;
      __dest[-3] = iVar7;
      __dest[-4] = iVar2;
    }
  }
  return this;
}

Assistant:

Array<T>& Array<T>::reserve(int m)
{
	int s=d().s;
	if (m <= s)
		return *this;
	int s1 = (m > s)? max(8*s/4, m) : s;
	T* b = _a;
	int n=d().n;
	if(s1 != s && s*sizeof(T) < 2048)
	{
		char* p = (char*) malloc( s1*sizeof(T)+sizeof(Data) );
		if(!p)
			ASL_BAD_ALLOC();
		b = (T*) ( p + sizeof(Data) );
		int i = min(m,n), j = sizeof(T), k = i*j;
		memcpy((char*)b, _a, k);
	}
	else if(s1 != s)
	{
		dup();
		int   rc = d().rc;
		ASL_RC_FREE();
		char* p = (char*) realloc( (char*)_a-sizeof(Data), s1*sizeof(T)+sizeof(Data) );
		if(!p)
			ASL_BAD_ALLOC();
		b = (T*) ( p + sizeof(Data) );
		_a = b;
		ASL_RC_INIT();
		d().rc = rc;
		d().s = s1;
		d().n = n;
		s1 = s;
	}
	if(s1 != s)
	{
		dup();
		int rc = d().rc;
		ASL_RC_FREE();
		char* p = (char*)_a - sizeof(Data);
		::free(p);
		_a = b;
		ASL_RC_INIT();
		d().rc = rc;
		d().s = s1;
		d().n = n;
	}
	return *this;
}